

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall gulps::gulps_print_output::log_message(gulps_print_output *this,message *msg)

{
  rgb local_9c;
  undefined1 local_98 [32];
  string_view local_78;
  rgb local_67 [6];
  rgb local_54;
  undefined1 local_50 [32];
  string_view local_30;
  rgb local_1b;
  message *local_18;
  message *msg_local;
  gulps_print_output *this_local;
  
  local_18 = msg;
  msg_local = (message *)this;
  if ((this->text_only & 1U) == 0) {
    fmt::v5::rgb::rgb(&local_1b,this->hdr_color);
    gulps::message::print_message_abi_cxx11_((message *)local_50,SUB81(local_18,0));
    fmt::v5::basic_string_view<char>::basic_string_view<std::char_traits<char>>
              (&local_30,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
    local_54.b = local_1b.b;
    local_54.r = local_1b.r;
    local_54.g = local_1b.g;
    fmt::v5::print<>(local_54,local_30);
    std::__cxx11::string::~string((string *)local_50);
  }
  fmt::v5::rgb::rgb(local_67,local_18->clr);
  gulps::message::print_text_abi_cxx11_((message *)local_98);
  fmt::v5::basic_string_view<char>::basic_string_view<std::char_traits<char>>
            (&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
            );
  local_9c.b = local_67[0].b;
  local_9c.r = local_67[0].r;
  local_9c.g = local_67[0].g;
  fmt::v5::print<>(local_9c,local_78);
  std::__cxx11::string::~string((string *)local_98);
  return;
}

Assistant:

void log_message(const message& msg) override
		{
			if(!text_only)
				fmt::print(hdr_color, msg.print_message(false));
			fmt::print(msg.clr, msg.print_text());
		}